

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

char * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop<char>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  size_t sVar1;
  RapidJSONException *this_00;
  size_t count_local;
  Stack<rapidjson::CrtAllocator> *this_local;
  
  sVar1 = GetSize(this);
  if (sVar1 < count) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: GetSize() >= count * sizeof(T)");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,
                cereal::RapidJSONException::~RapidJSONException);
  }
  this->stackTop_ = this->stackTop_ + -count;
  return this->stackTop_;
}

Assistant:

T* Pop(size_t count) {
        CEREAL_RAPIDJSON_ASSERT(GetSize() >= count * sizeof(T));
        stackTop_ -= count * sizeof(T);
        return reinterpret_cast<T*>(stackTop_);
    }